

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::ebml_read_master(MatroskaDemuxer *this,uint32_t *id)

{
  int iVar1;
  ostream *poVar2;
  VodCoreException *this_00;
  MatroskaLevel *level;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream ss;
  int local_2c;
  int64_t iStack_28;
  int res;
  int64_t length;
  uint32_t *id_local;
  MatroskaDemuxer *this_local;
  
  length = (int64_t)id;
  id_local = (uint32_t *)this;
  local_2c = ebml_read_element_id(this,id,(int *)0x0);
  if ((-1 < local_2c) &&
     (local_2c = ebml_read_element_length(this,&stack0xffffffffffffffd8), -1 < local_2c)) {
    if (this->num_levels < 0x10) {
      iVar1 = this->num_levels;
      this->num_levels = iVar1 + 1;
      this->levels[iVar1].start = (this->super_IOContextDemuxer).m_processedBytes;
      this->levels[iVar1].length = iStack_28;
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,"File moves beyond max. allowed depth (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x10);
    std::operator<<(poVar2,")");
    this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(this_00,900,&local_1d8);
    __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  return local_2c;
}

Assistant:

int MatroskaDemuxer::ebml_read_master(uint32_t *id)
{
    int64_t length;
    int res;

    if ((res = ebml_read_element_id(id, nullptr)) < 0 || (res = ebml_read_element_length(&length)) < 0)
        return res;

    /* protect... (Heaven forbids that the '>' is true) */
    if (num_levels >= EBML_MAX_DEPTH)
    {
        THROW(ERR_MATROSKA_PARSE, "File moves beyond max. allowed depth (" << EBML_MAX_DEPTH << ")")
    }

    /* remember level */
    MatroskaLevel *level = &levels[num_levels++];
    level->start = m_processedBytes;
    level->length = length;
    return 0;
}